

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

bool __thiscall QWidgetPrivate::handleClose(QWidgetPrivate *this,CloseMode mode)

{
  undefined1 *puVar1;
  QObject *pQVar2;
  QDebug this_00;
  uint uVar3;
  QWidgetPrivate *d;
  int *piVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 local_74;
  char *local_70;
  QDebug local_68;
  undefined1 local_60 [40];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(QObject **)&this->field_0x8;
  QtPrivateLogging::lcWidgetShowHide();
  if (((byte)QtPrivateLogging::lcWidgetShowHide::category.field_2.bools.enabledDebug._q_value.
             _M_base._M_i & 1) != 0) {
    local_88 = 2;
    uStack_84 = 0;
    uStack_80 = 0;
    uStack_7c = 0;
    uStack_78 = 0;
    local_74 = 0;
    local_70 = QtPrivateLogging::lcWidgetShowHide::category.name;
    QMessageLogger::debug();
    this_00.stream = local_68.stream;
    QVar6.m_data = (storage_type *)0x18;
    QVar6.m_size = (qsizetype)(local_60 + 0x10);
    QString::fromUtf8(QVar6);
    QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)(local_60 + 0x10));
    if ((QArrayData *)local_60._16_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_60._16_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_60._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_60._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_60._16_8_,2,0x10);
      }
    }
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    *(int *)((QTextStream *)local_68.stream + 0x28) =
         *(int *)((QTextStream *)local_68.stream + 0x28) + 1;
    ::operator<<((Stream *)(local_60 + 8),(QWidget *)local_60);
    QDebug::~QDebug((QDebug *)(local_60 + 8));
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug(&local_68);
  }
  uVar3 = *(uint *)&(this->data).field_0x10;
  bVar5 = true;
  if ((uVar3 >> 9 & 1) != 0) goto LAB_0030a33c;
  uVar3 = uVar3 | 0x200;
  *(uint *)&(this->data).field_0x10 = uVar3;
  if (pQVar2 == (QObject *)0x0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar2);
    uVar3 = *(uint *)&(this->data).field_0x10;
  }
  if ((mode == CloseNoEvent) || ((uVar3 & 0x40000) != 0)) {
LAB_0030a2aa:
    if (piVar4 == (int *)0x0) goto LAB_0030a33c;
    if (piVar4[1] != 0) {
      if (pQVar2 == (QObject *)0x0) {
        bVar5 = true;
        goto LAB_0030a32e;
      }
      if ((*(byte *)(*(long *)(pQVar2 + 0x20) + 10) & 1) == 0) {
        (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,0);
      }
    }
    bVar5 = true;
    if ((pQVar2 != (QObject *)0x0) && (piVar4[1] != 0)) {
      puVar1 = &(this->data).field_0x11;
      *puVar1 = *puVar1 & 0xfd;
      uVar3 = *(uint *)(*(long *)(pQVar2 + 8) + 0x240);
      if ((uVar3 >> 0x17 & 1) != 0) {
        *(uint *)(*(long *)(pQVar2 + 8) + 0x240) = uVar3 & 0xff7fffff;
        QObject::deleteLater();
      }
    }
  }
  else {
    local_88 = 0xaaaaaaaa;
    uStack_84 = 0xaaaaaaaa;
    uStack_80 = 0xaaaaaaaa;
    uStack_7c = 0xaaaaaaaa;
    QCloseEvent::QCloseEvent((QCloseEvent *)&local_88);
    if (mode == CloseWithSpontaneousEvent) {
      QCoreApplication::sendSpontaneousEvent(pQVar2,(QEvent *)&local_88);
    }
    else {
      QCoreApplication::sendEvent(pQVar2,(QEvent *)&local_88);
    }
    if ((((piVar4 == (int *)0x0) || (pQVar2 == (QObject *)0x0)) || (piVar4[1] == 0)) ||
       ((char)uStack_7c != '\0')) {
      QCloseEvent::~QCloseEvent((QCloseEvent *)&local_88);
      goto LAB_0030a2aa;
    }
    puVar1 = &(this->data).field_0x11;
    *puVar1 = *puVar1 & 0xfd;
    QCloseEvent::~QCloseEvent((QCloseEvent *)&local_88);
    bVar5 = false;
  }
LAB_0030a32e:
  LOCK();
  *piVar4 = *piVar4 + -1;
  UNLOCK();
  if (*piVar4 == 0) {
    operator_delete(piVar4);
  }
LAB_0030a33c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetPrivate::handleClose(CloseMode mode)
{
    Q_Q(QWidget);
    qCDebug(lcWidgetShowHide) << "Handling close event for" << q;

    if (data.is_closing)
        return true;

    // We might not have initiated the close, so update the state now that we know
    data.is_closing = true;

    QPointer<QWidget> that = q;

    if (data.in_destructor)
        mode = CloseNoEvent;

    if (mode != CloseNoEvent) {
        QCloseEvent e;
        if (mode == CloseWithSpontaneousEvent)
            QApplication::sendSpontaneousEvent(q, &e);
        else
            QCoreApplication::sendEvent(q, &e);
        if (!that.isNull() && !e.isAccepted()) {
            data.is_closing = false;
            return false;
        }
    }

    // even for windows, make sure we deliver a hide event and that all children get hidden
    if (!that.isNull() && !q->isHidden())
        q->hide();

    if (!that.isNull()) {
        data.is_closing = false;
        if (q->testAttribute(Qt::WA_DeleteOnClose)) {
            q->setAttribute(Qt::WA_DeleteOnClose, false);
            q->deleteLater();
        }
    }
    return true;
}